

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int make_table_recurse(archive_read *a,huffman_code *code,int node,huffman_table_entry *table,
                      int depth,int maxdepth)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  char *fmt;
  huffman_tree_node *phVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int depth_00;
  uint uVar8;
  
  phVar4 = code->tree;
  iVar5 = -depth;
  depth_00 = depth + 1;
  uVar8 = 0;
  do {
    if (phVar4 == (huffman_tree_node *)0x0) {
      fmt = "Huffman tree was not created.";
LAB_0046258b:
      archive_set_error(&a->archive,0x54,fmt);
      uVar6 = 0xffffffe2;
LAB_004625d7:
      return uVar6 | uVar8;
    }
    if ((node < 0) || (code->numentries <= node)) {
      fmt = "Invalid location to Huffman tree specified.";
      goto LAB_0046258b;
    }
    bVar1 = (byte)(maxdepth + iVar5) & 0x1f;
    uVar6 = 1 << bVar1;
    if (phVar4[(uint)node].branches[0] == phVar4[(uint)node].branches[1]) {
      uVar7 = (ulong)uVar6;
      if (1 << bVar1 < 1) {
        uVar7 = 0;
      }
      for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
        table[uVar3].length = -iVar5;
        table[uVar3].value = phVar4[(uint)node].branches[0];
      }
LAB_004625d2:
      uVar6 = 0;
      goto LAB_004625d7;
    }
    if (maxdepth + iVar5 == 0) {
      table->length = maxdepth + 1;
      table->value = node;
      goto LAB_004625d2;
    }
    uVar2 = make_table_recurse(a,code,phVar4[(uint)node].branches[0],table,depth_00,maxdepth);
    phVar4 = code->tree;
    node = phVar4[(uint)node].branches[1];
    table = table + (int)uVar6 / 2;
    uVar8 = uVar8 | uVar2;
    iVar5 = iVar5 + -1;
    depth_00 = depth_00 + 1;
  } while( true );
}

Assistant:

static int
make_table_recurse(struct archive_read *a, struct huffman_code *code, int node,
                   struct huffman_table_entry *table, int depth,
                   int maxdepth)
{
  int currtablesize, i, ret = (ARCHIVE_OK);

  if (!code->tree)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Huffman tree was not created.");
    return (ARCHIVE_FATAL);
  }
  if (node < 0 || node >= code->numentries)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid location to Huffman tree specified.");
    return (ARCHIVE_FATAL);
  }

  currtablesize = 1 << (maxdepth - depth);

  if (code->tree[node].branches[0] ==
    code->tree[node].branches[1])
  {
    for(i = 0; i < currtablesize; i++)
    {
      table[i].length = depth;
      table[i].value = code->tree[node].branches[0];
    }
  }
  else if (node < 0)
  {
    for(i = 0; i < currtablesize; i++)
      table[i].length = -1;
  }
  else
  {
    if(depth == maxdepth)
    {
      table[0].length = maxdepth + 1;
      table[0].value = node;
    }
    else
    {
      ret |= make_table_recurse(a, code, code->tree[node].branches[0], table,
                                depth + 1, maxdepth);
      ret |= make_table_recurse(a, code, code->tree[node].branches[1],
                         table + currtablesize / 2, depth + 1, maxdepth);
    }
  }
  return ret;
}